

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O2

void get_msurf_descriptors_haar_unroll_2_12_True
               (integral_image *iimage,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points)

{
  reference ipoint;
  size_t i;
  ulong __n;
  
  for (__n = 0; __n < (ulong)(((long)(interest_points->
                                     super__Vector_base<interest_point,_std::allocator<interest_point>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(interest_points->
                                    super__Vector_base<interest_point,_std::allocator<interest_point>_>
                                    )._M_impl.super__Vector_impl_data._M_start) / 0x114);
      __n = __n + 1) {
    ipoint = std::vector<interest_point,_std::allocator<interest_point>_>::at(interest_points,__n);
    get_msurf_descriptor_haar_unroll_2_12_True(iimage,ipoint);
  }
  return;
}

Assistant:

void get_msurf_descriptors_haar_unroll_2_12_True(struct integral_image* iimage, std::vector<struct interest_point> *interest_points) {
    for (size_t i=0; i<interest_points->size(); ++i) {
        get_msurf_descriptor_haar_unroll_2_12_True(iimage, &interest_points->at(i));
    }
}